

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_8::DiskHandle::write(DiskHandle *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ssize_t in_RAX;
  ssize_t sVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  long __offset;
  Fault f;
  Fault f_1;
  Fault local_50;
  Fault local_48;
  undefined8 uStack_40;
  
  __offset = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
LAB_0021fcb5:
    do {
      sVar2 = pwrite((this->fd).fd,__buf,__n,__offset);
      if (sVar2 < 0) {
        iVar1 = _::Debug::getOsErrorNumber(false);
        in_RAX = CONCAT44(extraout_var,iVar1);
        if (iVar1 == -1) goto LAB_0021fcb5;
      }
      else {
        iVar1 = 0;
        in_RAX = sVar2;
      }
      if (iVar1 != 0) {
        local_50.exception = (Exception *)0x0;
        local_48.exception = (Exception *)0x0;
        uStack_40 = 0;
        _::Debug::Fault::init
                  (&local_50,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::fatal(&local_50);
      }
      if (sVar2 < 1) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  (&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x179,FAILED,"n > 0","\"pwrite() returned zero?\"",
                   (char (*) [24])"pwrite() returned zero?");
        _::Debug::Fault::fatal(&local_48);
      }
      __offset = __offset + sVar2;
      __buf = (void *)((long)__buf + sVar2);
      __n = __n - sVar2;
    } while (__n != 0);
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const {
    // pwrite() probably never returns short writes unless there's no space left on disk.
    // Unfortunately, though, per spec we are not allowed to assume this.

    while (data.size() > 0) {
      ssize_t n;
      KJ_SYSCALL(n = pwrite(fd, data.begin(), data.size(), offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");
      offset += n;
      data = data.slice(n, data.size());
    }
  }